

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicsitem.cpp
# Opt level: O0

void QGraphicsObject::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QGraphicsObject *pQVar4;
  QGraphicsEffect *pQVar5;
  QGraphicsItemPrivate *pQVar6;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  _func_int **pp_Var7;
  _func_int **extraout_XMM0_Qa;
  _func_int **extraout_XMM0_Qa_00;
  QPointF QVar8;
  void *_v_1;
  void *_v;
  QGraphicsObject *_t;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  QGraphicsItem *in_stack_fffffffffffffeb8;
  QGraphicsItem *in_stack_fffffffffffffec0;
  QGraphicsItem *in_stack_fffffffffffffec8;
  QGraphicsItem *this;
  QGraphicsItem *in_stack_fffffffffffffed8;
  QGraphicsItem *in_stack_fffffffffffffee0;
  long *opacity;
  QGraphicsItem *in_stack_fffffffffffffef0;
  code *in_stack_fffffffffffffef8;
  _func_int **local_28;
  QGraphicsItemPrivate *local_20;
  _func_int **local_18;
  QGraphicsItemPrivate *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_fffffffffffffee0 = (QGraphicsItem *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffee0) {
    case (QGraphicsItem *)0x0:
      parentChanged((QGraphicsObject *)0x9911f1);
      break;
    case (QGraphicsItem *)0x1:
      opacityChanged((QGraphicsObject *)0x991203);
      break;
    case (QGraphicsItem *)0x2:
      visibleChanged((QGraphicsObject *)0x991215);
      break;
    case (QGraphicsItem *)0x3:
      enabledChanged((QGraphicsObject *)0x991227);
      break;
    case (QGraphicsItem *)0x4:
      xChanged((QGraphicsObject *)0x991239);
      break;
    case (QGraphicsItem *)0x5:
      yChanged((QGraphicsObject *)0x991248);
      break;
    case (QGraphicsItem *)0x6:
      zChanged((QGraphicsObject *)0x991257);
      break;
    case (QGraphicsItem *)0x7:
      rotationChanged((QGraphicsObject *)0x991266);
      break;
    case (QGraphicsItem *)0x8:
      scaleChanged((QGraphicsObject *)0x991275);
      break;
    case (QGraphicsItem *)0x9:
      childrenChanged((QGraphicsObject *)0x991284);
      break;
    case (QGraphicsItem *)0xa:
      widthChanged((QGraphicsObject *)0x991293);
      break;
    case (QGraphicsItem *)0xb:
      heightChanged((QGraphicsObject *)0x9912a2);
      break;
    case (QGraphicsItem *)0xc:
      updateMicroFocus((QGraphicsObject *)0x9912b1);
    }
  }
  if (in_ESI == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                      (in_RCX,(void **)parentChanged,0,0);
    if ((((((bVar2) ||
           (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                              (in_RCX,(void **)opacityChanged,0,1), bVar2)) ||
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             (in_RCX,(void **)visibleChanged,0,2), bVar2)) ||
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             (in_RCX,(void **)enabledChanged,0,3), bVar2 ||
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             (in_RCX,(void **)xChanged,0,4), bVar2)))) ||
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            (in_RCX,(void **)yChanged,0,5), bVar2 ||
         ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             (in_RCX,(void **)zChanged,0,6), bVar2 ||
          (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                             (in_RCX,(void **)rotationChanged,0,7), bVar2)))))) ||
       ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                           (in_RCX,(void **)scaleChanged,0,8), bVar2 ||
        ((bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            (in_RCX,(void **)childrenChanged,0,9), bVar2 ||
         (bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                            (in_RCX,(void **)widthChanged,0,10), bVar2)))))) goto LAB_00991b2e;
    in_stack_fffffffffffffef8 = heightChanged;
    bVar2 = QtMocHelpers::indexOfMethod<void(QGraphicsObject::*)()>
                      (in_RCX,(void **)heightChanged,0,0xb);
    if (bVar2) goto LAB_00991b2e;
  }
  if (in_ESI == 6) {
    if (in_EDX == 0) {
      iVar3 = qRegisterMetaType<QGraphicsObject*>();
      **(int **)in_RCX = iVar3;
    }
    else {
      **(undefined4 **)in_RCX = 0xffffffff;
    }
  }
  if (in_ESI == 1) {
    in_stack_fffffffffffffef0 = *(QGraphicsItem **)in_RCX;
    in_stack_fffffffffffffed8 = (QGraphicsItem *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffed8) {
    case (QGraphicsItem *)0x0:
      pQVar4 = QGraphicsItem::parentObject(in_stack_fffffffffffffec0);
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = (_func_int **)pQVar4;
      break;
    case (QGraphicsItem *)0x1:
      pp_Var7 = (_func_int **)QGraphicsItem::opacity((QGraphicsItem *)0x9916bc);
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0x2:
      bVar2 = QGraphicsItem::isEnabled((QGraphicsItem *)0x9916db);
      *(bool *)&in_stack_fffffffffffffef0->_vptr_QGraphicsItem = bVar2;
      break;
    case (QGraphicsItem *)0x3:
      bVar2 = QGraphicsItem::isVisible((QGraphicsItem *)0x9916fd);
      *(bool *)&in_stack_fffffffffffffef0->_vptr_QGraphicsItem = bVar2;
      break;
    case (QGraphicsItem *)0x4:
      QVar8 = QGraphicsItem::pos(in_stack_fffffffffffffeb8);
      local_18 = (_func_int **)QVar8.xp;
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = local_18;
      local_10 = (QGraphicsItemPrivate *)QVar8.yp;
      (in_stack_fffffffffffffef0->d_ptr).d = local_10;
      break;
    case (QGraphicsItem *)0x5:
      pp_Var7 = (_func_int **)
                QGraphicsItem::x((QGraphicsItem *)
                                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0x6:
      pp_Var7 = (_func_int **)
                QGraphicsItem::y((QGraphicsItem *)
                                 CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0x7:
      pp_Var7 = (_func_int **)QGraphicsItem::zValue((QGraphicsItem *)0x9917a1);
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0x8:
      pp_Var7 = (_func_int **)
                QGraphicsItem::rotation
                          ((QGraphicsItem *)
                           CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0x9:
      pp_Var7 = (_func_int **)
                QGraphicsItem::scale
                          ((QGraphicsItem *)
                           CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = pp_Var7;
      break;
    case (QGraphicsItem *)0xa:
      QVar8 = QGraphicsItem::transformOriginPoint(in_stack_fffffffffffffec8);
      local_28 = (_func_int **)QVar8.xp;
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = local_28;
      local_20 = (QGraphicsItemPrivate *)QVar8.yp;
      (in_stack_fffffffffffffef0->d_ptr).d = local_20;
      break;
    case (QGraphicsItem *)0xb:
      pQVar5 = QGraphicsItem::graphicsEffect((QGraphicsItem *)0x99183f);
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = (_func_int **)pQVar5;
      break;
    case (QGraphicsItem *)0xc:
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x99185d);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0xb])();
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = extraout_XMM0_Qa;
      break;
    case (QGraphicsItem *)0xd:
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x991882);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0xe])();
      in_stack_fffffffffffffef0->_vptr_QGraphicsItem = extraout_XMM0_Qa_00;
    }
  }
  if (in_ESI == 2) {
    opacity = *(long **)in_RCX;
    switch((QPointF *)(ulong)in_EDX) {
    case (QPointF *)0x0:
      this = (QGraphicsItem *)0x0;
      if (*opacity != 0) {
        this = (QGraphicsItem *)(*opacity + 0x10);
      }
      QGraphicsItem::setParentItem(this,(QGraphicsItem *)in_stack_fffffffffffffef8);
      break;
    case (QPointF *)0x1:
      QGraphicsItem::setOpacity(in_stack_fffffffffffffef0,(qreal)opacity);
      break;
    case (QPointF *)0x2:
      QGraphicsItem::setEnabled
                ((QGraphicsItem *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (bool)in_stack_fffffffffffffeaf);
      break;
    case (QPointF *)0x3:
      QGraphicsItem::setVisible
                (in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
      break;
    case (QPointF *)0x4:
      QGraphicsItem::setPos(in_stack_fffffffffffffec0,(QPointF *)in_stack_fffffffffffffeb8);
      break;
    case (QPointF *)0x5:
      QGraphicsItem::setX(in_stack_fffffffffffffeb8,
                          (qreal)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      break;
    case (QPointF *)0x6:
      QGraphicsItem::setY(in_stack_fffffffffffffeb8,
                          (qreal)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      break;
    case (QPointF *)0x7:
      QGraphicsItem::setZValue(in_stack_fffffffffffffee0,(qreal)in_stack_fffffffffffffed8);
      break;
    case (QPointF *)0x8:
      QGraphicsItem::setRotation(in_stack_fffffffffffffec8,(qreal)in_stack_fffffffffffffec0);
      break;
    case (QPointF *)0x9:
      QGraphicsItem::setScale(in_stack_fffffffffffffec8,(qreal)in_stack_fffffffffffffec0);
      break;
    case (QPointF *)0xa:
      QGraphicsItem::setTransformOriginPoint(in_stack_fffffffffffffed8,(QPointF *)(ulong)in_EDX);
      break;
    case (QPointF *)0xb:
      QGraphicsItem::setGraphicsEffect
                (in_stack_fffffffffffffee0,(QGraphicsEffect *)in_stack_fffffffffffffed8);
      break;
    case (QPointF *)0xc:
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x991a8b);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0xc])(*opacity);
      break;
    case (QPointF *)0xd:
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x991ab0);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0xf])(*opacity);
    }
  }
  if (in_ESI == 3) {
    if (in_EDX == 0xc) {
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x991b00);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0xd])();
    }
    else if (in_EDX == 0xd) {
      pQVar6 = QGraphicsItem::d_func((QGraphicsItem *)0x991b1c);
      (*pQVar6->_vptr_QGraphicsItemPrivate[0x10])();
    }
  }
LAB_00991b2e:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsObject::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QGraphicsObject *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->parentChanged(); break;
        case 1: _t->opacityChanged(); break;
        case 2: _t->visibleChanged(); break;
        case 3: _t->enabledChanged(); break;
        case 4: _t->xChanged(); break;
        case 5: _t->yChanged(); break;
        case 6: _t->zChanged(); break;
        case 7: _t->rotationChanged(); break;
        case 8: _t->scaleChanged(); break;
        case 9: _t->childrenChanged(); break;
        case 10: _t->widthChanged(); break;
        case 11: _t->heightChanged(); break;
        case 12: _t->updateMicroFocus(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::parentChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::opacityChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::visibleChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::enabledChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::xChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::yChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::zChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::rotationChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::scaleChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::childrenChanged, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::widthChanged, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QGraphicsObject::*)()>(_a, &QGraphicsObject::heightChanged, 11))
            return;
    }
    if (_c == QMetaObject::RegisterPropertyMetaType) {
        switch (_id) {
        default: *reinterpret_cast<int*>(_a[0]) = -1; break;
        case 0:
            *reinterpret_cast<int*>(_a[0]) = qRegisterMetaType< QGraphicsObject* >(); break;
        }
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QGraphicsObject**>(_v) = _t->parentObject(); break;
        case 1: *reinterpret_cast<qreal*>(_v) = _t->opacity(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->isEnabled(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isVisible(); break;
        case 4: *reinterpret_cast<QPointF*>(_v) = _t->pos(); break;
        case 5: *reinterpret_cast<qreal*>(_v) = _t->x(); break;
        case 6: *reinterpret_cast<qreal*>(_v) = _t->y(); break;
        case 7: *reinterpret_cast<qreal*>(_v) = _t->zValue(); break;
        case 8: *reinterpret_cast<qreal*>(_v) = _t->rotation(); break;
        case 9: *reinterpret_cast<qreal*>(_v) = _t->scale(); break;
        case 10: *reinterpret_cast<QPointF*>(_v) = _t->transformOriginPoint(); break;
        case 11: *reinterpret_cast<QGraphicsEffect**>(_v) = _t->graphicsEffect(); break;
        case 12: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->width(); break;
        case 13: *reinterpret_cast<qreal*>(_v) = _t->QGraphicsItem::d_func()->height(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setParentItem(*reinterpret_cast<QGraphicsObject**>(_v)); break;
        case 1: _t->setOpacity(*reinterpret_cast<qreal*>(_v)); break;
        case 2: _t->setEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setVisible(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setPos(*reinterpret_cast<QPointF*>(_v)); break;
        case 5: _t->setX(*reinterpret_cast<qreal*>(_v)); break;
        case 6: _t->setY(*reinterpret_cast<qreal*>(_v)); break;
        case 7: _t->setZValue(*reinterpret_cast<qreal*>(_v)); break;
        case 8: _t->setRotation(*reinterpret_cast<qreal*>(_v)); break;
        case 9: _t->setScale(*reinterpret_cast<qreal*>(_v)); break;
        case 10: _t->setTransformOriginPoint(*reinterpret_cast<QPointF*>(_v)); break;
        case 11: _t->setGraphicsEffect(*reinterpret_cast<QGraphicsEffect**>(_v)); break;
        case 12: _t->QGraphicsItem::d_func()->setWidth(*reinterpret_cast<qreal*>(_v)); break;
        case 13: _t->QGraphicsItem::d_func()->setHeight(*reinterpret_cast<qreal*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 12: _t->QGraphicsItem::d_func()->resetWidth(); break;
        case 13: _t->QGraphicsItem::d_func()->resetHeight(); break;
        default: break;
        }
    }
}